

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O3

void branch_report(ReportWriter *writer,RomAccessor *rom,Trace *op_trace,
                  AnnotationResolver *annotations)

{
  _Rb_tree_color p;
  Pointer resolve_adress;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  Annotation *target_annotation;
  Annotation *source_annotation;
  Annotation *local_1070;
  Pointer local_1064;
  RomAccessor *local_1060;
  Annotation *local_1058;
  _Base_ptr local_1050;
  _Base_ptr local_1048;
  ReportWriter *local_1040;
  StringBuilder local_1034;
  
  local_1060 = rom;
  memset(&local_1034,0,0x1000);
  ReportWriter::writeSeperator(writer,"Branch analysis");
  ReportWriter::writeComment
            (writer,
             "NOTE: Branches between two functions could mean that they really are one function.");
  ReportWriter::writeComment
            (writer,
             "      Branches out from a function could mean that the function is larger than tagged."
            );
  ReportWriter::writeComment
            (writer,"      This report was generated AFTER extra branches were predicted.");
  local_1040 = writer;
  ReportWriter::writeComment(writer,"");
  local_1034._length = 0;
  local_1034._backing[0] = '\0';
  local_1048 = (op_trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1050 = &(op_trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_1048 != local_1050) {
    do {
      p = local_1048[1]._M_color;
      bVar3 = snestistics::RomAccessor::evalByte(local_1060,p);
      if ((&snestistics::branches)[bVar3] == '\x01') {
        local_1064 = p + _S_black;
        bVar2 = true;
        do {
          bVar1 = bVar2;
          resolve_adress = p + 2;
          if (bVar1) {
            bVar3 = snestistics::RomAccessor::evalByte(local_1060,local_1064);
            resolve_adress = (p - 0xfe) + (uint)bVar3;
            if (-1 < (char)bVar3) {
              resolve_adress = (uint)bVar3 + p + 2;
            }
          }
          local_1058 = (Annotation *)0x0;
          local_1070 = (Annotation *)0x0;
          snestistics::AnnotationResolver::resolve_annotation
                    (annotations,p,&local_1058,(Annotation **)0x0);
          snestistics::AnnotationResolver::resolve_annotation
                    (annotations,resolve_adress,&local_1070,(Annotation **)0x0);
          if ((local_1058 != (Annotation *)0x0) && (local_1058 != local_1070)) {
            local_1034._length = 0;
            local_1034._backing[0] = '\0';
            snestistics::StringBuilder::format
                      (&local_1034,"Branch going from %s",(local_1058->name)._M_dataplus._M_p);
            if (local_1070 != (Annotation *)0x0) {
              snestistics::StringBuilder::format
                        (&local_1034," to %s",(local_1070->name)._M_dataplus._M_p);
            }
            snestistics::StringBuilder::format(&local_1034," [%06X->%06X]",(ulong)p);
            ReportWriter::writeComment(local_1040,&local_1034);
          }
          bVar2 = false;
        } while (bVar1);
      }
      local_1048 = (_Base_ptr)std::_Rb_tree_increment(local_1048);
    } while (local_1048 != local_1050);
  }
  return;
}

Assistant:

void branch_report(ReportWriter &writer, const RomAccessor &rom, const Trace &op_trace, const AnnotationResolver &annotations) {
	StringBuilder sb;
	writer.writeSeperator("Branch analysis");
	writer.writeComment("NOTE: Branches between two functions could mean that they really are one function.");
	writer.writeComment("      Branches out from a function could mean that the function is larger than tagged.");
	writer.writeComment("      This report was generated AFTER extra branches were predicted.");
	writer.writeComment("");

	sb.clear();

	for (const auto &it : op_trace.ops) {
		const Pointer pc = it.first;
		uint8_t opcode = rom.evalByte(pc);
		if (!branches[opcode])
			continue;

		for (int myloop = 0; myloop < 2; myloop++) {
			Pointer target = myloop == 0 ? branch8(pc, rom.evalByte(pc+1)) : pc + 2;
			if (myloop == 1 && opcode == 0x80)
				break;

			const Annotation *source_annotation = nullptr, *target_annotation = nullptr;
			annotations.resolve_annotation(pc,     &source_annotation);
			annotations.resolve_annotation(target, &target_annotation);

			if (!source_annotation || source_annotation == target_annotation)
				continue;

			sb.clear();
			sb.format("Branch going from %s", source_annotation->name.c_str());
						
			if (target_annotation) {
				sb.format(" to %s", target_annotation->name.c_str());
			}
			sb.format(" [%06X->%06X]", pc, target);
			writer.writeComment(sb);
		}
	}
}